

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O3

bool __thiscall pg::RTLSolver::rtl(RTLSolver *this,bitset *SG,int only_player,int depth)

{
  bitset *this_00;
  bitset *Z_00;
  ulong *puVar1;
  uint maxpr;
  int iVar2;
  int iVar3;
  Game *pGVar4;
  byte bVar5;
  char cVar6;
  bitset *pbVar7;
  bitset *R;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  long lVar13;
  ostream *poVar14;
  Error *this_01;
  undefined4 in_register_0000000c;
  size_t sVar15;
  long lVar16;
  size_t pos;
  size_t sVar17;
  uint pl;
  ulong uVar18;
  int *piVar19;
  int iVar20;
  uint uVar21;
  ulong __n;
  ulong uVar22;
  bitset Z;
  bool local_c8;
  bitset local_a0;
  _label_vertex local_80;
  bitset *local_70;
  int local_64;
  bitset local_60;
  ulong local_40;
  bitset *local_38;
  
  local_40 = CONCAT44(in_register_0000000c,depth);
  uVar22 = SG->_bitssize;
  local_60._size = SG->_size;
  local_60._bitssize = SG->_bitssize;
  uVar18 = uVar22 * 8;
  local_60._allocsize = uVar18;
  puVar11 = (uint64_t *)operator_new__(-(ulong)(uVar22 >> 0x3d != 0) | uVar18);
  local_60._bits = puVar11;
  if (uVar22 != 0) {
    memmove(puVar11,SG->_bits,uVar18);
  }
  local_a0._size = ((this->super_Solver).game)->n_vertices;
  uVar18 = local_a0._size + 0x3f;
  local_a0._bitssize = uVar18 >> 6;
  __n = local_a0._bitssize << 3;
  local_a0._allocsize = __n;
  puVar12 = (uint64_t *)operator_new__(__n);
  local_a0._bits = puVar12;
  if (0x3f < uVar18) {
    memset(puVar12,0,__n);
  }
  if (uVar22 != 0) {
    lVar13 = uVar22 * -0x40;
    do {
      lVar13 = lVar13 + 0x40;
      if (puVar11[uVar22 - 1] != 0) {
        lVar16 = LZCOUNT(puVar11[uVar22 - 1]);
        if (lVar13 - lVar16 != 0x40) {
          this_00 = &this->V;
          Z_00 = &this->W;
          local_70 = &this->S;
          local_38 = &this->G;
          local_c8 = false;
          pos = lVar16 - lVar13 ^ 0x3f;
          local_64 = (int)local_40 + 1;
          goto LAB_0016e19a;
        }
        break;
      }
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
  }
  local_c8 = false;
  goto LAB_0016e111;
code_r0x0016e7d8:
  sVar15 = sVar15 - 1;
  if (sVar15 == 0) goto LAB_0016e859;
  goto LAB_0016e7ce;
LAB_0016e859:
  sVar15 = (this->V)._bitssize;
  if (sVar15 == 0) goto LAB_0016eb21;
  lVar13 = sVar15 * -0x40;
  do {
    lVar13 = lVar13 + 0x40;
    if (this_00->_bits[sVar15 - 1] != 0) {
      lVar16 = LZCOUNT(this_00->_bits[sVar15 - 1]);
      if (lVar13 - lVar16 != 0x40) {
        sVar15 = lVar16 - lVar13 ^ 0x3f;
        goto LAB_0016e8b7;
      }
      break;
    }
    sVar15 = sVar15 - 1;
  } while (sVar15 != 0);
  goto LAB_0016eb21;
  while (sVar15 = bitset::find_prev(this_00,sVar15), sVar15 != 0xffffffffffffffff) {
LAB_0016e8b7:
    uVar18 = sVar15 >> 6;
    if ((local_a0._bits[uVar18] >> (sVar15 & 0x3f) & 1) != 0) {
      if (1 < (this->super_Solver).trace) {
        poVar14 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\x1b[1;37mattracting to top vertex \x1b[36m",0x25);
        local_80.g = (this->super_Solver).game;
        local_80.v = (uint)sVar15;
        poVar14 = operator<<(poVar14,&local_80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
      }
      uVar22 = 1L << (sVar15 & 0x3f);
      puVar1 = (this->W)._bits + uVar18;
      *puVar1 = *puVar1 | uVar22;
      local_a0._bits[uVar18] = local_a0._bits[uVar18] & ~uVar22;
      iVar20 = (this->Q).pointer;
      (this->Q).pointer = iVar20 + 1;
      (this->Q).queue[iVar20] = (uint)sVar15;
      break;
    }
  }
LAB_0016eb21:
  while( true ) {
    iVar20 = (this->Q).pointer;
    if ((long)iVar20 == 0) break;
    (this->Q).pointer = iVar20 + -1;
    uVar10 = (this->Q).queue[(long)iVar20 + -1];
    bVar5 = (byte)uVar10 & 0x3f;
    local_a0._bits[(ulong)(long)(int)uVar10 >> 6] =
         local_a0._bits[(ulong)(long)(int)uVar10 >> 6] &
         (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
    attractVertices(this,pl ^ 1,uVar10,&local_a0,Z_00,&local_a0,maxpr);
    attractTangles(this,pl ^ 1,uVar10,&local_a0,Z_00,&local_a0,maxpr);
  }
  bVar8 = true;
LAB_0016ebb5:
  if (bVar8) {
LAB_0016ebbd:
    sVar15 = (this->V)._bitssize;
    if (sVar15 != 0) {
      memset(this_00->_bits,0,sVar15 << 3);
    }
    sVar15 = (this->W)._bitssize;
    if (sVar15 != 0) {
      memset(Z_00->_bits,0,sVar15 << 3);
    }
    uVar18 = 0;
    do {
      if (local_a0._bitssize == uVar18) goto LAB_0016ec46;
      puVar11 = local_a0._bits + uVar18;
      uVar18 = uVar18 + 1;
    } while (*puVar11 == 0);
    iVar20 = this->dominions;
    bVar8 = rtl(this,&local_a0,only_player,local_64);
    if (iVar20 != this->dominions) goto LAB_0016ec70;
    local_c8 = (bool)(local_c8 | bVar8);
LAB_0016ec46:
    if (local_a0._bitssize != 0) {
      memset(local_a0._bits,0,local_a0._bitssize << 3);
    }
    for (; pos != 0xffffffffffffffff; pos = bitset::find_prev(&local_60,pos)) {
LAB_0016e19a:
      maxpr = ((this->super_Solver).game)->_priority[(int)pos];
      pl = maxpr & 1;
      if ((only_player == -1) || (pl == only_player)) {
        do {
          uVar10 = (uint)pos;
          uVar9 = ((this->super_Solver).game)->_priority[(int)uVar10] ^ maxpr;
          if ((uVar9 & 1) != 0) goto LAB_0016e3de;
          if (1 < (this->super_Solver).trace) {
            poVar14 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"\x1b[1;37mattracting to \x1b[36m",0x1a);
            local_80.g = (this->super_Solver).game;
            local_80.v = uVar10;
            poVar14 = operator<<(poVar14,&local_80);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m for \x1b[1;36m",0xf);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," (pr: ",6);
            poVar14 = (ostream *)
                      std::ostream::operator<<
                                (poVar14,((this->super_Solver).game)->_priority[(int)uVar10]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
            std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          uVar18 = 1L << (pos & 0x3f);
          puVar1 = (this->V)._bits + (pos >> 6);
          *puVar1 = *puVar1 | uVar18;
          local_a0._bits[pos >> 6] = local_a0._bits[pos >> 6] | uVar18;
          this->str[pos] = -1;
          iVar20 = (this->Q).pointer;
          (this->Q).pointer = iVar20 + 1;
          (this->Q).queue[iVar20] = uVar10;
          while( true ) {
            iVar20 = (this->Q).pointer;
            if ((long)iVar20 == 0) break;
            (this->Q).pointer = iVar20 + -1;
            uVar10 = (this->Q).queue[(long)iVar20 + -1];
            bVar5 = (byte)uVar10 & 0x3f;
            local_60._bits[(ulong)(long)(int)uVar10 >> 6] =
                 local_60._bits[(ulong)(long)(int)uVar10 >> 6] &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            attractVertices(this,pl,uVar10,&local_60,&local_a0,&local_60,maxpr);
            attractTangles(this,pl,uVar10,&local_60,&local_a0,&local_60,maxpr);
          }
          pos = bitset::find_prev(&local_60,pos);
        } while (pos != 0xffffffffffffffff);
        pos = 0xffffffffffffffff;
LAB_0016e3de:
        if (1 < (this->super_Solver).trace) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ",0x11);
          uVar18 = local_40 & 0xffffffff;
          if (0 < (int)local_40) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger,"*",1);
              uVar21 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar21;
            } while (uVar21 != 0);
          }
          poVar14 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[1;36m",7);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,maxpr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
          if (local_a0._bitssize != 0) {
            lVar13 = local_a0._bitssize * -0x40;
            sVar15 = local_a0._bitssize;
            do {
              lVar13 = lVar13 + 0x40;
              if (local_a0._bits[sVar15 - 1] != 0) {
                lVar16 = LZCOUNT(local_a0._bits[sVar15 - 1]);
                if (lVar13 - lVar16 != 0x40) {
                  sVar15 = lVar16 - lVar13 ^ 0x3f;
                  do {
                    poVar14 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14," \x1b[1;38;5;15m",0xd);
                    local_80.g = (this->super_Solver).game;
                    local_80.v = (int)sVar15;
                    poVar14 = operator<<(poVar14,&local_80);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
                    if (this->str[sVar15] != -1) {
                      poVar14 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"->",2);
                      local_80.g = (this->super_Solver).game;
                      local_80.v = this->str[sVar15];
                      operator<<(poVar14,&local_80);
                    }
                    sVar15 = bitset::find_prev(&local_a0,sVar15);
                  } while (sVar15 != 0xffffffffffffffff);
                }
                break;
              }
              sVar15 = sVar15 - 1;
            } while (sVar15 != 0);
          }
          poVar14 = (this->super_Solver).logger;
          cVar6 = (char)poVar14;
          std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
        }
        if ((only_player == -1) && ((uVar9 & 1) == 0)) {
LAB_0016e77a:
          lVar13 = ((this->super_Solver).game)->n_vertices;
          if (lVar13 != 0) {
            memset(this->pea_vidx,0,lVar13 << 2);
          }
          this->pea_curidx = 1;
          sVar15 = (this->V)._bitssize;
          if (sVar15 != 0) {
            iVar20 = this->dominions;
            lVar13 = sVar15 * -0x40;
LAB_0016e7ce:
            lVar13 = lVar13 + 0x40;
            if (this_00->_bits[sVar15 - 1] == 0) goto code_r0x0016e7d8;
            lVar16 = LZCOUNT(this_00->_bits[sVar15 - 1]);
            if (lVar13 - lVar16 != 0x40) {
              sVar15 = lVar16 - lVar13 ^ 0x3f;
              do {
                if ((local_a0._bits[sVar15 >> 6] >> (sVar15 & 0x3f) & 1) == 0) {
                  this_01 = (Error *)__cxa_allocate_exception(0x40);
                  Error::Error(this_01,"logic error",
                               "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                               ,0x203);
                  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
                }
                bVar8 = extractTangles(this,(int)sVar15,&local_a0);
                local_c8 = (bool)(local_c8 | bVar8);
                sVar15 = bitset::find_prev(this_00,sVar15);
                pbVar7 = local_70;
              } while (sVar15 != 0xffffffffffffffff);
              iVar2 = this->dominions;
              bVar8 = iVar20 == iVar2;
              if (!bVar8) {
                for (sVar15 = bitset::find_first(local_70); sVar15 != 0xffffffffffffffff;
                    sVar15 = bitset::find_next(pbVar7,sVar15)) {
                  iVar3 = (this->Q).pointer;
                  (this->Q).pointer = iVar3 + 1;
                  (this->Q).queue[iVar3] = (uint)sVar15;
                }
                while( true ) {
                  R = local_38;
                  pbVar7 = local_70;
                  iVar3 = (this->Q).pointer;
                  if ((long)iVar3 == 0) break;
                  (this->Q).pointer = iVar3 + -1;
                  uVar10 = (this->Q).queue[(long)iVar3 + -1];
                  attractVertices(this,pl,uVar10,local_38,local_70,local_38,0x7fffffff);
                  attractTangles(this,pl,uVar10,R,pbVar7,R,0x7fffffff);
                }
                sVar15 = bitset::find_first(local_70);
                pbVar7 = local_38;
                for (; sVar15 != 0xffffffffffffffff; sVar15 = bitset::find_next(local_70,sVar15)) {
                  Oink::solve((this->super_Solver).oink,(int)sVar15,pl,this->str[sVar15]);
                }
                sVar15 = (this->G)._bitssize;
                puVar11 = (this->S)._bits;
                if (sVar15 != 0) {
                  puVar12 = pbVar7->_bits;
                  sVar17 = 0;
                  do {
                    puVar12[sVar17] = puVar12[sVar17] & ~puVar11[sVar17];
                    sVar17 = sVar17 + 1;
                  } while (sVar15 != sVar17);
                }
                sVar15 = (this->S)._bitssize;
                if (sVar15 != 0) {
                  memset(puVar11,0,sVar15 << 3);
                }
                sVar15 = (this->V)._bitssize;
                if (sVar15 == 0) goto LAB_0016ebb5;
                memset(this_00->_bits,0,sVar15 << 3);
                if (iVar20 == iVar2) goto LAB_0016ebbd;
                goto LAB_0016ec70;
              }
            }
            goto LAB_0016e859;
          }
          goto LAB_0016eb21;
        }
        sVar15 = (this->V)._bitssize;
        if (sVar15 != 0) {
          lVar13 = sVar15 * -0x40;
          do {
            lVar13 = lVar13 + 0x40;
            if (this_00->_bits[sVar15 - 1] != 0) {
              lVar16 = LZCOUNT(this_00->_bits[sVar15 - 1]);
              if (lVar13 - lVar16 != 0x40) {
                uVar18 = lVar16 - lVar13 ^ 0x3f;
                do {
                  pGVar4 = (this->super_Solver).game;
                  uVar10 = (uint)uVar18;
                  uVar22 = 1L << (uVar18 & 0x3f);
                  if ((((pGVar4->_owner)._bits[(ulong)(long)(int)uVar10 >> 6] >> (uVar18 & 0x3f) & 1
                       ) == 0) == (bool)((byte)maxpr & 1)) {
                    iVar20 = pGVar4->_outedges[pGVar4->_firstouts[(int)uVar10]];
                    if (iVar20 != -1) {
                      piVar19 = pGVar4->_outedges + (long)pGVar4->_firstouts[(int)uVar10] + 1;
                      do {
                        if ((local_60._bits[(ulong)(long)iVar20 >> 6] >> ((long)iVar20 & 0x3fU) & 1)
                            != 0) goto LAB_0016e642;
                        iVar20 = *piVar19;
                        piVar19 = piVar19 + 1;
                      } while (iVar20 != -1);
                    }
                  }
                  else if (this->str[uVar18] == -1) {
LAB_0016e642:
                    Z_00->_bits[uVar18 >> 6] = Z_00->_bits[uVar18 >> 6] | uVar22;
                    local_a0._bits[uVar18 >> 6] = local_a0._bits[uVar18 >> 6] & ~uVar22;
                    iVar20 = (this->Q).pointer;
                    (this->Q).pointer = iVar20 + 1;
                    (this->Q).queue[iVar20] = uVar10;
                  }
                  uVar18 = bitset::find_prev(this_00,uVar18);
                } while (uVar18 != 0xffffffffffffffff);
              }
              break;
            }
            sVar15 = sVar15 - 1;
          } while (sVar15 != 0);
        }
        iVar20 = (this->Q).pointer;
        if (iVar20 == 0) goto LAB_0016e77a;
        do {
          (this->Q).pointer = iVar20 + -1;
          uVar10 = (this->Q).queue[(long)iVar20 + -1];
          bVar5 = (byte)uVar10 & 0x3f;
          local_a0._bits[(ulong)(long)(int)uVar10 >> 6] =
               local_a0._bits[(ulong)(long)(int)uVar10 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          attractVertices(this,pl ^ 1,uVar10,&local_a0,Z_00,&local_a0,maxpr);
          attractTangles(this,pl ^ 1,uVar10,&local_a0,Z_00,&local_a0,maxpr);
          iVar20 = (this->Q).pointer;
        } while (iVar20 != 0);
        goto LAB_0016ebbd;
      }
    }
  }
  else {
LAB_0016ec70:
    local_c8 = true;
  }
  puVar12 = local_a0._bits;
  if (local_a0._bits != (uint64_t *)0x0) {
LAB_0016e111:
    operator_delete__(puVar12);
  }
  if (local_60._bits != (uint64_t *)0x0) {
    operator_delete__(local_60._bits);
  }
  return local_c8;
}

Assistant:

bool
RTLSolver::rtl(bitset &SG, int only_player, int depth)
{
    bitset R(SG); // make a local copy of SG
    bitset Z(nodecount());

    bool new_tangles = false;

    auto top = R.find_last();

    while (top != bitset::npos) {
        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (only_player != -1 && only_player != pl) {
            // oh. 
            top = R.find_prev(top);
            continue;
        }
            
        // attract from all heads with priority <pr> that are in <R>
        for (; top != bitset::npos; top = R.find_prev(top)) {
            if ((priority(top)&1) != (pr&1)) break; // otf compress
            // if (priority(top) != pr) break; // disable otf compress

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[1;37mattracting to \033[36m" << label_vertex(top) << "\033[m for \033[1;36m" << pl << "\033[m" << " (pr: " << priority(top) << ")" << std::endl;
            }
#endif

            V[top] = true; // heads
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                R[v] = false; // remove from <R>
                attractVertices(pl, v, R, Z, R, pr);
                attractTangles(pl, v, R, Z, R, pr);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m ";
            for (int i=0; i<depth; i++) logger << "*";
            logger << "\033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        bool leaks = false;

        if (!(only_player == -1 and top == bitset::npos)) { // if not lowest region
            // figure out what are good heads.
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                // check if open
                if (owner(v) == pl) {
                    if (str[v] == -1) {
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                    }
                } else {
                    for (auto curedge = outs(v); *curedge != -1; curedge++) {
                        if (R[*curedge]) {
                            W[v] = true;
                            Z[v] = false;
                            Q.push(v);
                            break;
                        }
                    }
                }
            }

            leaks = Q.nonempty();

            while (Q.nonempty()) {
                const int v = Q.pop();
                Z[v] = false; // remove from <Z>
                attractVertices(1-pl, v, Z, W, Z, pr);
                attractTangles(1-pl, v, Z, W, Z, pr);
            }
        }

        if (!leaks) {
            /**
             * Extract tangles by computing bottom SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a top vertex.
             */

            std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
            pea_curidx = 1;

            const auto D = dominions;
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                if (!Z[v]) LOGIC_ERROR;
                if (extractTangles(v, Z)) new_tangles = true;
            }

            // Extend any dominions that were found.
            // (Any solved vertices are now in <S>.)
            if (D != dominions) {
                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) Q.push(v);

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(pl, v, G, S, G, INT_MAX);
                    attractTangles(pl, v, G, S, G, INT_MAX);
                }

                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) {
                    Solver::solve(v, pl, str[v]);
                }

                G -= S; // remove from G
                S.reset();
                V.reset();
                return true; // end tl so that we can restart...
            }

            // now if we want to recursively decompose closed regions,
            // we need to remove some top part of the region.
            // the fact that we attract to multiple tops makes this a bit awkward, though.
            // TODO: a better method might be to simply check all newly learned tangles, and
            // then avoid the top vertices of those new tangles?
            if (RECURSIVE_CLOSED_REGIONS) {
                for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                    if (Z[v]) {
                        if (trace >= 2) {
                            logger << "\033[1;37mattracting to top vertex \033[36m" << label_vertex(v) << "\033[m" << std::endl;
                        }
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                        break; // only pick one highest-priority vertex to avoid
                    }
                }

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    Z[v] = false; // remove from <Z>
                    attractVertices(1-pl, v, Z, W, Z, pr);
                    attractTangles(1-pl, v, Z, W, Z, pr);
                }
            }
        }

        if (RECURSIVE_CLOSED_REGIONS || leaks) {
            V.reset();
            W.reset();

            if (Z.any()) {
                const auto D = dominions;
                if (rtl(Z, only_player, depth+1)) {
                    new_tangles = true;
                }
                if (D != dominions) return true; // full restart
            }
        } else {
            V.reset();
        }

        Z.reset();
    }

    return new_tangles;
}